

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxplus.cpp
# Opt level: O0

void __thiscall libDAI::MaxPlus::MaxPlus(MaxPlus *this,FactorGraph *fg,Properties *opts,size_t k)

{
  byte bVar1;
  int iVar2;
  undefined8 uVar3;
  VarSet *P;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *__x;
  edge_type *peVar4;
  long *plVar5;
  Var *this_00;
  undefined4 extraout_var;
  reference pvVar6;
  long in_RCX;
  long *in_RSI;
  long *in_RDI;
  size_t j;
  Index indi;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ind;
  size_t I;
  size_t i;
  size_t iI;
  value_type *in_stack_fffffffffffffd88;
  FactorGraph *in_stack_fffffffffffffd90;
  Var *in_stack_fffffffffffffd98;
  VarSet *in_stack_fffffffffffffda0;
  FactorGraph *in_stack_fffffffffffffda8;
  DAIAlg<libDAI::FactorGraph> *in_stack_fffffffffffffdb0;
  size_type in_stack_fffffffffffffdb8;
  allocator<char> *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  string *in_stack_fffffffffffffe00;
  size_t in_stack_fffffffffffffe08;
  Exception *in_stack_fffffffffffffe10;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *this_01;
  VarSet *ns;
  Index *in_stack_fffffffffffffe70;
  size_type local_128;
  Index local_100;
  undefined8 local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a0 [2];
  unsigned_long local_70;
  unsigned_long local_68;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *local_60;
  undefined1 local_52;
  long local_20;
  long *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  DAIAlg<libDAI::FactorGraph>::DAIAlg
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
             (Properties *)in_stack_fffffffffffffda0);
  *in_RDI = (long)&PTR_clone_00d4e838;
  in_RDI[0x23] = 0;
  in_RDI[0x24] = 0;
  in_RDI[0x25] = 0;
  in_RDI[0x26] = 0;
  in_RDI[0x27] = 0;
  {unnamed_type#1}::MaxPlus((anon_struct_40_5_28472d03_for_Props *)0xbaf67b);
  in_RDI[0x28] = 0;
  in_RDI[0x29] = 0;
  *(undefined1 (*) [16])(in_RDI + 0x2a) = (undefined1  [16])0x0;
  in_RDI[0x2c] = 0;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0xbaf6d2);
  in_RDI[0x2d] = 0;
  in_RDI[0x2e] = 0;
  in_RDI[0x2f] = 0;
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::vector
            ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)0xbaf70d);
  in_RDI[0x30] = 0;
  in_RDI[0x31] = 0;
  in_RDI[0x32] = 0;
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::vector
            ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)0xbaf748);
  in_RDI[0x33] = (long)local_10;
  (**(code **)(*local_10 + 0x28))();
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xbaf79d);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdb0,
             (size_type)in_stack_fffffffffffffda8,(allocator_type *)in_stack_fffffffffffffda0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xbaf7c9);
  in_RDI[0x38] = local_20;
  std::__cxx11::
  list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::list((list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          *)0xbaf7f4);
  in_RDI[0x3c] = -0x10000000000001;
  *(undefined1 *)(in_RDI + 0x3d) = 0;
  in_RDI[0x3e] = 0;
  in_RDI[0x3f] = 0;
  bVar1 = (**(code **)(*in_RDI + 0x88))();
  if ((bVar1 & 1) == 0) {
    local_52 = 1;
    uVar3 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    Exception::Exception
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    local_52 = 0;
    __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
  }
  ns = (VarSet *)(in_RDI + 0x2d);
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::clear
            ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)0xbaf9d0);
  P = (VarSet *)(**(code **)(*in_RDI + 0x20))();
  FactorGraph::nrEdges((FactorGraph *)0xbaf9f8);
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::reserve
            ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
             in_stack_fffffffffffffdd0,(size_type)in_stack_fffffffffffffdc8);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           *)0xbafa35);
  (**(code **)(*in_RDI + 0x20))();
  FactorGraph::nrEdges((FactorGraph *)0xbafa5d);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::reserve((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  local_60 = (vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)0x0;
  while( true ) {
    this_01 = local_60;
    (**(code **)(*in_RDI + 0x20))();
    __x = (vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
          FactorGraph::nrEdges((FactorGraph *)0xbafac2);
    if (__x <= this_01) break;
    (**(code **)(*in_RDI + 0x20))();
    peVar4 = FactorGraph::edge(in_stack_fffffffffffffd90,(size_t)in_stack_fffffffffffffd88);
    local_68 = peVar4->first;
    (**(code **)(*in_RDI + 0x20))();
    peVar4 = FactorGraph::edge(in_stack_fffffffffffffd90,(size_t)in_stack_fffffffffffffd88);
    local_70 = peVar4->second;
    plVar5 = (long *)(**(code **)(*in_RDI + 0x20))();
    this_00 = (Var *)(**(code **)(*plVar5 + 0x30))(plVar5,local_68);
    Var::states(this_00);
    TProb<double>::TProb((TProb<double> *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::push_back
              ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
               in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    TProb<double>::~TProb((TProb<double> *)0xbafc09);
    plVar5 = (long *)(**(code **)(*in_RDI + 0x20))();
    (**(code **)(*plVar5 + 0x50))(plVar5,local_70);
    TFactor<double>::stateSpace((TFactor<double> *)0xbafc48);
    local_a8 = 0;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xbafc6d);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdb0,
               (size_type)in_stack_fffffffffffffda8,
               (value_type_conflict2 *)in_stack_fffffffffffffda0,
               (allocator_type *)in_stack_fffffffffffffd98);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xbafc9b);
    in_stack_fffffffffffffdc0 = (allocator<char> *)(**(code **)(*in_RDI + 0x20))();
    in_stack_fffffffffffffdb8 =
         (**(code **)(*(long *)in_stack_fffffffffffffdc0 + 0x30))
                   (in_stack_fffffffffffffdc0,local_68);
    VarSet::VarSet(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    in_stack_fffffffffffffdb0 = (DAIAlg<libDAI::FactorGraph> *)(**(code **)(*in_RDI + 0x20))();
    iVar2 = (*(in_stack_fffffffffffffdb0->super_InferenceAlgorithm)._vptr_InferenceAlgorithm[10])
                      (in_stack_fffffffffffffdb0,local_70);
    in_stack_fffffffffffffda8 = (FactorGraph *)CONCAT44(extraout_var,iVar2);
    in_stack_fffffffffffffda0 = TFactor<double>::vars((TFactor<double> *)in_stack_fffffffffffffda8);
    Index::Index(in_stack_fffffffffffffe70,P,ns);
    VarSet::~VarSet((VarSet *)0xbafd53);
    local_128 = 0;
    while( true ) {
      in_stack_fffffffffffffd98 = (Var *)Index::operator_cast_to_long(&local_100);
      if ((long)in_stack_fffffffffffffd98 < 0) break;
      in_stack_fffffffffffffd90 = (FactorGraph *)Index::operator_cast_to_long(&local_100);
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_a0,local_128);
      *pvVar6 = (value_type)in_stack_fffffffffffffd90;
      Index::operator++((Index *)in_stack_fffffffffffffdb0);
      local_128 = local_128 + 1;
    }
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::push_back((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)in_stack_fffffffffffffda0,(value_type *)in_stack_fffffffffffffd98);
    Index::~Index((Index *)in_stack_fffffffffffffd90);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffda0);
    local_60 = (vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
               ((long)&(local_60->
                       super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + 1);
  }
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator=
            (this_01,__x);
  return;
}

Assistant:

MaxPlus::MaxPlus(const FactorGraph & fg, const Properties &opts, size_t k ) 
        : 
            DAIAlgFG(fg, opts), Props(), _maxdiff(0.0), _iterations(0UL), 
            _indices(), _messages(), _newmessages(),
            _g(&fg) , bestConfiguration( fg.nrVars() ), 
            _k(k),
            _k_th_Val(-DBL_MAX),
            writeAnyTimeResults(false), results_f(NULL), timings_f(NULL)
    {
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);

        // clear messages
        _messages.clear();
        _messages.reserve(grm().nrEdges());

        // clear indices
        _indices.clear();
        _indices.reserve(grm().nrEdges());

        // create messages and indices
        for( size_t iI = 0; iI < grm().nrEdges(); iI++ ) {
            size_t i = grm().edge(iI).first;
            size_t I = grm().edge(iI).second;

            _messages.push_back( Prob( grm().var(i).states() ) );

            vector<size_t> ind( grm().factor(I).stateSpace(), 0 );
            Index indi (grm().var(i), grm().factor(I).vars() );
            for( size_t j = 0; indi >= 0; ++indi,++j )
                ind[j] = indi; 
            _indices.push_back( ind );
        }

        // create new_messages
        _newmessages = _messages;
    }